

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

int __thiscall
ON_Mesh::AddNgon_Expert
          (ON_Mesh *this,uint Fcount,uint *ngon_fi,bool bPermitHoles,
          ON_MeshVertexFaceMap *vertexFaceMap)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  uint local_d8;
  uint local_bc;
  uint vi_count;
  uint local_b0;
  uint fi;
  uint i;
  bool bCheckNgonMap;
  uint ngon_count0;
  int face_count;
  ON_MeshFaceList *local_88;
  ON_MeshFaceList *mesh_face_list;
  undefined1 local_70 [8];
  ON_3dPointListRef mesh_vertex_list;
  ON_SimpleArray<unsigned_int> ngon_vi;
  uint ngon_index;
  ON_MeshVertexFaceMap *vertexFaceMap_local;
  bool bPermitHoles_local;
  uint *ngon_fi_local;
  uint Fcount_local;
  ON_Mesh *this_local;
  
  if ((Fcount == 0) || (ngon_fi == (uint *)0x0)) {
    return -1;
  }
  ON_SimpleArray<unsigned_int>::ON_SimpleArray
            ((ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP);
  ON_3dPointListRef::ON_3dPointListRef((ON_3dPointListRef *)local_70,this);
  ON_MeshFaceList::ON_MeshFaceList((ON_MeshFaceList *)&ngon_count0,this);
  local_88 = (ON_MeshFaceList *)&ngon_count0;
  uVar2 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  bVar1 = HasNgons(this);
  if (bVar1) {
    local_d8 = NgonUnsignedCount(this);
  }
  else {
    local_d8 = 0;
  }
  bVar1 = false;
  if (local_d8 != 0) {
    uVar3 = ON_SimpleArray<unsigned_int>::Count(&this->m_NgonMap);
    bVar1 = uVar2 == uVar3;
  }
  local_b0 = 0;
  do {
    if (Fcount <= local_b0) {
      if (bPermitHoles) {
        local_bc = ON_MeshNgon::FindNgonBoundary
                             ((ON_3dPointListRef *)local_70,local_88,vertexFaceMap,(ulong)Fcount,
                              ngon_fi,(ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP);
      }
      else {
        local_bc = ON_MeshNgon::FindNgonOuterBoundary
                             ((ON_3dPointListRef *)local_70,local_88,vertexFaceMap,(ulong)Fcount,
                              ngon_fi,(ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP);
      }
      if ((local_bc < 3) ||
         (iVar4 = ON_SimpleArray<unsigned_int>::Count
                            ((ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP), iVar4 < 3)) {
        this_local._4_4_ = -1;
      }
      else {
        uVar2 = ON_SimpleArray<unsigned_int>::UnsignedCount
                          ((ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP);
        puVar5 = ON_SimpleArray<unsigned_int>::Array
                           ((ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP);
        this_local._4_4_ = AddNgon(this,uVar2,puVar5,Fcount,ngon_fi);
      }
LAB_007503ab:
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray
                ((ON_SimpleArray<unsigned_int> *)&mesh_vertex_list.m_fP);
      return this_local._4_4_;
    }
    if (uVar2 <= ngon_fi[local_b0]) {
      this_local._4_4_ = -1;
      goto LAB_007503ab;
    }
    if ((bVar1) &&
       (puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_NgonMap,ngon_fi[local_b0]),
       *puVar5 < local_d8)) {
      this_local._4_4_ = -1;
      goto LAB_007503ab;
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

int ON_Mesh::AddNgon_Expert(
  unsigned int Fcount,
  const unsigned int* ngon_fi,
  bool bPermitHoles,
  ON_MeshVertexFaceMap* vertexFaceMap
)
{
  unsigned int ngon_index = ON_UNSET_UINT_INDEX;
  if (Fcount < 1 || nullptr == ngon_fi)
    return ngon_index;

  ON_SimpleArray<unsigned int> ngon_vi;
  const ON_3dPointListRef mesh_vertex_list(this);
  const ON_MeshFaceList& mesh_face_list(this);

  const int face_count = m_F.Count();
  const unsigned int ngon_count0 = HasNgons() ? NgonUnsignedCount() : 0U;
  bool bCheckNgonMap = (ngon_count0 > 0 && face_count == m_NgonMap.Count());
  for (unsigned int i = 0; i < Fcount; ++i)
  {
    unsigned int fi = ngon_fi[i];
    if (fi >= (unsigned int)face_count)
      return ngon_index;
    if (bCheckNgonMap && m_NgonMap[fi] < ngon_count0)
      return ngon_index; // input faces are already in an ngon
  }

  unsigned int vi_count;
  if (bPermitHoles)
    vi_count = ON_MeshNgon::FindNgonBoundary(
      mesh_vertex_list,
      mesh_face_list,
      vertexFaceMap,
      Fcount,
      ngon_fi,
      ngon_vi
    );
  else
    vi_count = ON_MeshNgon::FindNgonOuterBoundary(
      mesh_vertex_list,
      mesh_face_list,
      vertexFaceMap,
      Fcount,
      ngon_fi,
      ngon_vi
    );

  if (vi_count < 3 || ngon_vi.Count() < 3)
    return ngon_index; // 

  return AddNgon(ngon_vi.UnsignedCount(), ngon_vi.Array(), Fcount, ngon_fi);
}